

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O0

cx_string<35UL> *
mserialize::cx_strcat<1ul,33ul,1ul>
          (cx_string<1UL> *strings,cx_string<33UL> *strings_1,cx_string<1UL> *strings_2)

{
  cx_string<1UL> *in_RCX;
  cx_string<33UL> *in_RDX;
  cx_string<1UL> *in_RSI;
  cx_string<35UL> *in_RDI;
  size_t s;
  size_t i;
  char *out;
  size_t size [4];
  char *data [4];
  char buffer [36];
  char *in_stack_ffffffffffffff60;
  ulong local_98;
  char *local_90;
  ulong local_88;
  size_t local_80;
  size_t local_78;
  size_t local_70;
  char *local_68;
  data_ref local_60;
  data_ref local_58;
  data_ref local_50;
  char local_48 [48];
  cx_string<1UL> *local_18;
  cx_string<33UL> *local_10;
  cx_string<1UL> *local_8;
  
  local_18 = in_RCX;
  local_10 = in_RDX;
  local_8 = in_RSI;
  memset(local_48,0,0x24);
  local_68 = "";
  local_60 = cx_string<1UL>::data(local_8);
  local_58 = cx_string<33UL>::data(local_10);
  local_50 = cx_string<1UL>::data(local_18);
  local_88 = 0;
  local_80 = cx_string<1UL>::size(local_8);
  local_78 = cx_string<33UL>::size(local_10);
  local_70 = cx_string<1UL>::size(local_18);
  local_90 = local_48;
  for (local_98 = 1; local_98 < 4; local_98 = local_98 + 1) {
    for (in_stack_ffffffffffffff60 = (char *)0x0;
        in_stack_ffffffffffffff60 < (cx_string<35UL> *)(&local_88)[local_98];
        in_stack_ffffffffffffff60 = in_stack_ffffffffffffff60 + 1) {
      *local_90 = in_stack_ffffffffffffff60[(long)(&local_68)[local_98]];
      local_90 = local_90 + 1;
    }
  }
  cx_string<35UL>::cx_string((cx_string<35UL> *)in_stack_ffffffffffffff60,in_RDI->_data);
  return in_RDI;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}